

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int COVER_strict_cmp(void *lp,void *rp)

{
  void *in_RSI;
  void *in_RDI;
  int result;
  COVER_ctx_t *unaff_retaddr;
  int local_14;
  
  local_14 = COVER_cmp(unaff_retaddr,in_RDI,in_RSI);
  if ((local_14 == 0) && (local_14 = 1, in_RDI < in_RSI)) {
    local_14 = -1;
  }
  return local_14;
}

Assistant:

static int WIN_CDECL COVER_strict_cmp(const void *lp, const void *rp) {
  int result = COVER_cmp(g_coverCtx, lp, rp);
  if (result == 0) {
    result = lp < rp ? -1 : 1;
  }
  return result;
}